

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ptimeprofiler.c
# Opt level: O0

PTimeProfiler * p_time_profiler_new(void)

{
  puint64 pVar1;
  PTimeProfiler *ret;
  
  ret = (PTimeProfiler *)p_malloc0(8);
  if (ret == (PTimeProfiler *)0x0) {
    printf("** Error: %s **\n","PTimeProfiler: failed to allocate memory");
    ret = (PTimeProfiler *)0x0;
  }
  else {
    pVar1 = p_time_profiler_get_ticks_internal();
    ret->counter = pVar1;
  }
  return ret;
}

Assistant:

P_LIB_API PTimeProfiler *
p_time_profiler_new ()
{
	PTimeProfiler *ret;

	if (P_UNLIKELY ((ret = p_malloc0 (sizeof (PTimeProfiler))) == NULL)) {
		P_ERROR ("PTimeProfiler: failed to allocate memory");
		return NULL;
	}

	ret->counter = p_time_profiler_get_ticks_internal ();

	return ret;
}